

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O0

void Cec_ManPrintFlopEquivs(Gia_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  Gia_Obj_t *pObj_00;
  void *pvVar5;
  bool bVar6;
  int local_24;
  int i;
  Gia_Obj_t *pRepr;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  if (p->vNamesIn == (Vec_Ptr_t *)0x0) {
    __assert_fail("p->vNamesIn != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecCorr.c"
                  ,0x45d,"void Cec_ManPrintFlopEquivs(Gia_Man_t *)");
  }
  local_24 = 0;
  while( true ) {
    iVar2 = Gia_ManRegNum(p);
    bVar6 = false;
    if (local_24 < iVar2) {
      iVar2 = Gia_ManPiNum(p);
      pRepr = Gia_ManCi(p,iVar2 + local_24);
      bVar6 = pRepr != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar2 = Gia_ObjId(p,pRepr);
    iVar2 = Gia_ObjIsConst(p,iVar2);
    if (iVar2 == 0) {
      iVar2 = Gia_ObjId(p,pRepr);
      pObj_00 = Gia_ObjReprObj(p,iVar2);
      if (pObj_00 != (Gia_Obj_t *)0x0) {
        iVar2 = Gia_ObjIsCi(pObj_00);
        if (iVar2 == 0) {
          pVVar1 = p->vNamesIn;
          iVar2 = Gia_ObjCioId(pRepr);
          pvVar4 = Vec_PtrEntry(pVVar1,iVar2);
          uVar3 = Gia_ObjId(p,pObj_00);
          Abc_Print(1,"Original flop %s is proved equivalent to internal node %d.\n",pvVar4,
                    (ulong)uVar3);
        }
        else {
          pVVar1 = p->vNamesIn;
          iVar2 = Gia_ObjCioId(pRepr);
          pvVar4 = Vec_PtrEntry(pVVar1,iVar2);
          pVVar1 = p->vNamesIn;
          iVar2 = Gia_ObjCioId(pObj_00);
          pvVar5 = Vec_PtrEntry(pVVar1,iVar2);
          Abc_Print(1,"Original flop %s is proved equivalent to flop %s.\n",pvVar4,pvVar5);
        }
      }
    }
    else {
      pVVar1 = p->vNamesIn;
      iVar2 = Gia_ObjCioId(pRepr);
      pvVar4 = Vec_PtrEntry(pVVar1,iVar2);
      Abc_Print(1,"Original flop %s is proved equivalent to constant.\n",pvVar4);
    }
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void Cec_ManPrintFlopEquivs( Gia_Man_t * p )
{
    Gia_Obj_t * pObj, * pRepr;
    int i;
    assert( p->vNamesIn != NULL );
    Gia_ManForEachRo( p, pObj, i )
    {
        if ( Gia_ObjIsConst(p, Gia_ObjId(p, pObj)) )
            Abc_Print( 1, "Original flop %s is proved equivalent to constant.\n", Vec_PtrEntry(p->vNamesIn, Gia_ObjCioId(pObj)) );
        else if ( (pRepr = Gia_ObjReprObj(p, Gia_ObjId(p, pObj))) )
        {
            if ( Gia_ObjIsCi(pRepr) )
                Abc_Print( 1, "Original flop %s is proved equivalent to flop %s.\n",
                    Vec_PtrEntry( p->vNamesIn, Gia_ObjCioId(pObj)  ),
                    Vec_PtrEntry( p->vNamesIn, Gia_ObjCioId(pRepr) ) );
            else
                Abc_Print( 1, "Original flop %s is proved equivalent to internal node %d.\n",
                    Vec_PtrEntry( p->vNamesIn, Gia_ObjCioId(pObj) ), Gia_ObjId(p, pRepr) );
        }
    }
}